

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeMemoryReportFormatter.cpp
# Opt level: O3

bool __thiscall
CodeMemoryReportFormatter::variableExists
          (CodeMemoryReportFormatter *this,SimpleString *variableName)

{
  bool bVar1;
  CodeReportingAllocationNode *otherBuffer;
  SimpleString local_30;
  
  otherBuffer = this->codeReportingList_;
  if (otherBuffer == (CodeReportingAllocationNode *)0x0) {
    bVar1 = false;
  }
  else {
    do {
      SimpleString::SimpleString(&local_30,otherBuffer->variableName_);
      bVar1 = operator==(variableName,&local_30);
      SimpleString::~SimpleString(&local_30);
      if (bVar1) {
        return bVar1;
      }
      otherBuffer = otherBuffer->next_;
    } while (otherBuffer != (CodeReportingAllocationNode *)0x0);
  }
  return bVar1;
}

Assistant:

bool CodeMemoryReportFormatter::variableExists(const SimpleString& variableName)
{
    CodeReportingAllocationNode* current = codeReportingList_;
    while (current) {
        if (variableName == current->variableName_)
            return true;
        current = current->next_;
    }
    return false;
}